

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deliminator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Deliminator::Optimize
          (Deliminator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<duckdb::JoinWithDelimGet,_true> *this_00;
  LogicalComparisonJoin *delim_join;
  pointer pJVar1;
  JoinWithDelimGet *pJVar2;
  long lVar3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  bool bVar5;
  ulong uVar6;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  iterator __begin1;
  pointer pDVar7;
  JoinWithDelimGet *join;
  const_iterator __position;
  pointer this_01;
  pointer pJVar8;
  byte bVar9;
  __normal_iterator<duckdb::JoinWithDelimGet_*,_std::vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>_>
  __i;
  pointer pJVar10;
  bool all_equality_conditions;
  vector<duckdb::DelimCandidate,_true> candidates;
  bool local_61;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  pointer local_50;
  vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_> local_48;
  
  (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (in_RDX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (pointer)op;
  local_60 = in_RDX;
  local_58._M_head_impl = (LogicalOperator *)this;
  FindCandidates((Deliminator *)op,in_RDX,(vector<duckdb::DelimCandidate,_true> *)&local_48);
  local_50 = local_48.
             super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pDVar7 = local_48.
           super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    for (; pDVar7 != local_50; pDVar7 = pDVar7 + 1) {
      delim_join = pDVar7->delim_join;
      pJVar8 = (pDVar7->joins).
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar1 = (pDVar7->joins).
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar8 != pJVar1) {
        uVar6 = (long)pJVar1 - (long)pJVar8 >> 4;
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                  (pJVar8,pJVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pJVar1 - (long)pJVar8 < 0x101) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pJVar8,pJVar1);
          this_01 = pJVar8;
        }
        else {
          pJVar10 = pJVar8 + 0x10;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pJVar8,pJVar10);
          for (; this_01 = pJVar8, pJVar10 != pJVar1; pJVar10 = pJVar10 + 1) {
            pJVar8 = pJVar10;
            ::std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                      ();
          }
        }
      }
      __position._M_current =
           (pDVar7->joins).
           super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           _M_impl.super__Vector_impl_data._M_start;
      bVar9 = 1;
      if (__position._M_current !=
          (pDVar7->joins).
          super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (pointer)op;
        bVar5 = HasSelection((Deliminator *)op,(LogicalOperator *)delim_join);
        this_00 = &pDVar7->joins;
        __position._M_current =
             (this_00->
             super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>).
             super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (bVar5) {
          this_01 = (pointer)this_00;
          ::std::vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>::erase
                    (&this_00->
                      super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                     ,__position);
          __position._M_current =
               (this_00->
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>).
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_start;
          bVar9 = 0;
        }
      }
      local_61 = true;
      pJVar2 = (pDVar7->joins).
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (; __position._M_current != pJVar2; __position._M_current = __position._M_current + 1) {
        this_01 = (pointer)op;
        bVar5 = RemoveJoinWithDelimGet
                          ((Deliminator *)op,delim_join,pDVar7->delim_get_count,
                           ((__position._M_current)->join)._M_data,&local_61);
        bVar9 = bVar9 & bVar5;
      }
      if (((long)(pDVar7->joins).
                 super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                 super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pDVar7->joins).
                 super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                 super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == pDVar7->delim_get_count & bVar9)
          != 0) {
        (delim_join->super_LogicalJoin).super_LogicalOperator.type = LOGICAL_COMPARISON_JOIN;
        this_01 = (pointer)&delim_join->duplicate_eliminated_columns;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::clear((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)this_01);
      }
      if ((delim_join->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\b') {
        TrySwitchSingleToLeft((Deliminator *)this_01,delim_join);
      }
    }
  }
  _Var4._M_head_impl = local_58._M_head_impl;
  (local_58._M_head_impl)->_vptr_LogicalOperator =
       (_func_int **)
       (local_60->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (local_60->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  ::std::vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>::~vector(&local_48)
  ;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )_Var4._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Deliminator::Optimize(unique_ptr<LogicalOperator> op) {
	root = op;

	vector<DelimCandidate> candidates;
	FindCandidates(op, candidates);

	if (candidates.empty()) {
		return op;
	}

	for (auto &candidate : candidates) {
		auto &delim_join = candidate.delim_join;

		// Sort these so the deepest are first
		std::sort(candidate.joins.begin(), candidate.joins.end(),
		          [](const JoinWithDelimGet &lhs, const JoinWithDelimGet &rhs) { return lhs.depth > rhs.depth; });

		bool all_removed = true;
		if (!candidate.joins.empty() && HasSelection(delim_join)) {
			// Keep the deepest join with DelimGet in these cases,
			// as the selection can greatly reduce the cost of the RHS child of the DelimJoin
			candidate.joins.erase(candidate.joins.begin());
			all_removed = false;
		}

		bool all_equality_conditions = true;
		for (auto &join : candidate.joins) {
			all_removed = RemoveJoinWithDelimGet(delim_join, candidate.delim_get_count, join.join.get(),
			                                     all_equality_conditions) &&
			              all_removed;
		}

		// Change type if there are no more duplicate-eliminated columns
		if (candidate.joins.size() == candidate.delim_get_count && all_removed) {
			delim_join.type = LogicalOperatorType::LOGICAL_COMPARISON_JOIN;
			delim_join.duplicate_eliminated_columns.clear();
		}

		// Only DelimJoins are ever created as SINGLE joins,
		// and we can switch from SINGLE to LEFT if the RHS is de-duplicated by an aggr
		if (delim_join.join_type == JoinType::SINGLE) {
			TrySwitchSingleToLeft(delim_join);
		}
	}

	return op;
}